

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O2

void __thiscall JUnitTestOutput::writeFailure(JUnitTestOutput *this,JUnitTestCaseResultNode *node)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  SimpleString buf;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40;
  SimpleString local_30;
  
  (*node->failure_->_vptr_TestFailure[2])(&local_60);
  pcVar2 = SimpleString::asCharString(&local_60);
  uVar1 = (*node->failure_->_vptr_TestFailure[5])();
  (*node->failure_->_vptr_TestFailure[6])(&local_50);
  (*(this->super_TestOutput)._vptr_TestOutput[0x20])(&local_40,this,&local_50);
  pcVar3 = SimpleString::asCharString(&local_40);
  StringFromFormat((char *)&local_30,
                   "<failure message=\"%s:%d: %s\" type=\"AssertionFailedError\">\n",pcVar2,
                   (ulong)uVar1,pcVar3);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_60);
  pcVar2 = SimpleString::asCharString(&local_30);
  SimpleString::SimpleString(&local_60,pcVar2);
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_60);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"</failure>\n");
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_60);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_30);
  return;
}

Assistant:

void JUnitTestOutput::writeFailure(JUnitTestCaseResultNode* node)
{
    SimpleString buf = StringFromFormat(
            "<failure message=\"%s:%d: %s\" type=\"AssertionFailedError\">\n",
            node->failure_->getFileName().asCharString(),
            (int) node->failure_->getFailureLineNumber(),
            encodeXmlText(node->failure_->getMessage()).asCharString());
    writeToFile(buf.asCharString());
    writeToFile("</failure>\n");
}